

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
util::
dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
::dynamic_array(dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
                *this,size_type_conflict count_in,const_reference value_in,allocator_type *alloc_in)

{
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *this_00;
  allocator_type my_alloc;
  undefined8 uStack_28;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020ad18;
  this->elem_count = count_in;
  this->elems = (pointer)0x0;
  if (count_in != 0) {
    uStack_28 = &PTR__dynamic_array_0020ad18;
    this_00 = (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
              __gnu_cxx::
              new_allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>
              ::allocate((new_allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>
                          *)((long)&uStack_28 + 7),count_in,(void *)0x0);
    this->elems = (pointer)this_00;
    if (this->elem_count != 0) {
      do {
        dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
                  (this_00,(dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            *)value_in);
        this_00->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020ac40;
        this_00 = this_00 + 1;
      } while (this_00 !=
               (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
               (this->elems + this->elem_count));
    }
  }
  return;
}

Assistant:

explicit constexpr dynamic_array(size_type count_in,
                                     const_reference value_in = value_type(),
                                     const allocator_type& alloc_in = allocator_type())
      : elem_count(count_in)
    {
      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        allocator_type my_alloc(alloc_in);

        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);

        iterator it = begin();

        while(it != end())
        {
          std::allocator_traits<allocator_type>::construct(my_alloc, it, value_in);

          ++it;
        }
      }
    }